

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
CompileLanguageNode::Evaluate
          (string *__return_storage_ptr__,CompileLanguageNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  GeneratorExpressionContent *pGVar1;
  bool bVar2;
  __type _Var3;
  ulong uVar4;
  const_reference pvVar5;
  long lVar6;
  char *local_2a8;
  bool local_239;
  allocator local_20a;
  allocator local_209;
  string local_208;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  string local_1a0;
  allocator local_179;
  string local_178;
  string local_158;
  string local_138 [8];
  string genName;
  string local_110;
  string local_f0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b8;
  cmGlobalGenerator *local_b0;
  cmGlobalGenerator *gg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabledLanguages;
  allocator local_79;
  string local_78;
  string local_58;
  cmGeneratorExpressionDAGChecker *local_38;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  CompileLanguageNode *this_local;
  
  local_38 = dagChecker;
  dagChecker_local = (cmGeneratorExpressionDAGChecker *)content;
  content_local = (GeneratorExpressionContent *)context;
  context_local = (cmGeneratorExpressionContext *)parameters;
  parameters_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (CompileLanguageNode *)__return_storage_ptr__;
  uVar4 = std::__cxx11::string::empty();
  pGVar1 = content_local;
  if ((uVar4 & 1) != 0) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_58,(GeneratorExpressionContent *)dagChecker_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_78,
               "$<COMPILE_LANGUAGE:...> may only be used to specify include directories compile definitions, compile options and to evaluate components of the file(GENERATE) command."
               ,&local_79);
    reportError((cmGeneratorExpressionContext *)pGVar1,&local_58,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&gg);
  local_b0 = cmLocalGenerator::GetGlobalGenerator
                       ((cmLocalGenerator *)
                        content_local[4].IdentifierChildren.
                        super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
  cmGlobalGenerator::GetEnabledLanguages
            (local_b0,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gg);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)context_local);
  local_239 = false;
  if (!bVar2) {
    local_c0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&gg);
    local_c8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&gg);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)context_local);
    local_b8 = std::
               find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                         (local_c0,local_c8,pvVar5);
    local_d0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&gg);
    local_239 = __gnu_cxx::operator==(&local_b8,&local_d0);
  }
  pGVar1 = content_local;
  if (local_239 != false) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_f0,(GeneratorExpressionContent *)dagChecker_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_110,"$<COMPILE_LANGUAGE:...> Unknown language.",
               (allocator *)(genName.field_2._M_local_buf + 0xf));
    reportError((cmGeneratorExpressionContext *)pGVar1,&local_f0,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)(genName.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    genName.field_2._8_4_ = 1;
    goto LAB_0074e71d;
  }
  (*local_b0->_vptr_cmGlobalGenerator[3])(local_138);
  lVar6 = std::__cxx11::string::find((char *)local_138,0x99770f);
  pGVar1 = content_local;
  if (lVar6 == -1) {
    lVar6 = std::__cxx11::string::find((char *)local_138,0x99771d);
    if (lVar6 == -1) {
      lVar6 = std::__cxx11::string::find((char *)local_138,0x99b654);
      if (((lVar6 != -1) ||
          (lVar6 = std::__cxx11::string::find((char *)local_138,0x985c34), lVar6 != -1)) ||
         (lVar6 = std::__cxx11::string::find((char *)local_138,0x98b57d), pGVar1 = content_local,
         lVar6 != -1)) goto LAB_0074e607;
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                (&local_1e8,(GeneratorExpressionContent *)dagChecker_local);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_208,"$<COMPILE_LANGUAGE:...> not supported for this generator.",
                 &local_209);
      reportError((cmGeneratorExpressionContext *)pGVar1,&local_1e8,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    else if ((local_38 == (cmGeneratorExpressionDAGChecker *)0x0) ||
            ((bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingCompileDefinitions(local_38),
             !bVar2 && (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingIncludeDirectories
                                          (local_38), !bVar2)))) {
LAB_0074e607:
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)context_local);
      if (bVar2) {
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,(string *)&content_local[4].StartContent);
      }
      else {
        pGVar1 = content_local + 4;
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)context_local);
        _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&pGVar1->StartContent,pvVar5);
        if (_Var3) {
          local_2a8 = "1";
        }
        else {
          local_2a8 = "0";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,local_2a8,&local_20a);
        std::allocator<char>::~allocator((allocator<char> *)&local_20a);
      }
    }
    else {
      pGVar1 = content_local;
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                (&local_1a0,(GeneratorExpressionContent *)dagChecker_local);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1c0,
                 "$<COMPILE_LANGUAGE:...> may only be used with COMPILE_OPTIONS with the Xcode generator."
                 ,&local_1c1);
      reportError((cmGeneratorExpressionContext *)pGVar1,&local_1a0,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_158,(GeneratorExpressionContent *)dagChecker_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_178,
               "$<COMPILE_LANGUAGE:...> may not be used with Visual Studio generators.",&local_179);
    reportError((cmGeneratorExpressionContext *)pGVar1,&local_158,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  genName.field_2._8_4_ = 1;
  std::__cxx11::string::~string(local_138);
LAB_0074e71d:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gg);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string> &parameters,
                       cmGeneratorExpressionContext *context,
                       const GeneratorExpressionContent *content,
                       cmGeneratorExpressionDAGChecker *dagChecker) const
  {
    if(context->Language.empty())
      {
      reportError(context, content->GetOriginalExpression(),
          "$<COMPILE_LANGUAGE:...> may only be used to specify include "
          "directories compile definitions, compile options and to evaluate "
          "components of the file(GENERATE) command.");
      return std::string();
      }

    std::vector<std::string> enabledLanguages;
    cmGlobalGenerator* gg = context->LG->GetGlobalGenerator();
    gg->GetEnabledLanguages(enabledLanguages);
    if (!parameters.empty() &&
          std::find(enabledLanguages.begin(), enabledLanguages.end(),
                  parameters.front()) == enabledLanguages.end())
      {
      reportError(context, content->GetOriginalExpression(),
          "$<COMPILE_LANGUAGE:...> Unknown language.");
      return std::string();
      }
    std::string genName = gg->GetName();
    if (genName.find("Visual Studio") != std::string::npos)
      {
      reportError(context, content->GetOriginalExpression(),
          "$<COMPILE_LANGUAGE:...> may not be used with Visual Studio "
          "generators.");
      return std::string();
      }
    else if (genName.find("Xcode") != std::string::npos)
      {
      if (dagChecker && (dagChecker->EvaluatingCompileDefinitions()
          || dagChecker->EvaluatingIncludeDirectories()))
        {
        reportError(context, content->GetOriginalExpression(),
            "$<COMPILE_LANGUAGE:...> may only be used with COMPILE_OPTIONS "
            "with the Xcode generator.");
        return std::string();
        }
      }
    else
      {
      if(genName.find("Makefiles") == std::string::npos &&
              genName.find("Ninja") == std::string::npos &&
              genName.find("Watcom WMake") == std::string::npos)
        {
        reportError(context, content->GetOriginalExpression(),
            "$<COMPILE_LANGUAGE:...> not supported for this generator.");
        return std::string();
        }
      }
    if (parameters.empty())
      {
      return context->Language;
      }
    return context->Language == parameters.front() ? "1" : "0";
  }